

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS
ref_split_edge_density
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_INT RVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  REF_INT cell;
  char *pcVar8;
  int iVar9;
  REF_DBL area;
  REF_INT nodes [27];
  double local_f0;
  REF_INT local_e4;
  REF_NODE local_e0;
  uint *local_d8;
  long local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  REF_INT local_a8 [30];
  
  local_e0 = ref_grid->node;
  *allowed = 1;
  if (ref_grid->twod != 0) {
    local_b8 = 0.0;
    dStack_b0 = 0.0;
    if (-1 < node0) {
      ref_cell = ref_grid->cell[3];
      pRVar1 = ref_cell->ref_adj;
      if ((node0 < pRVar1->nnode) && (local_d0 = (long)pRVar1->first[(uint)node0], local_d0 != -1))
      {
        pRVar2 = pRVar1->item + local_d0;
        RVar3 = ref_cell->node_per;
        local_d8 = (uint *)allowed;
        do {
          if (0 < RVar3) {
            cell = pRVar2->ref;
            iVar9 = 0;
            local_e4 = cell;
            do {
              if (ref_cell->c2n[ref_cell->size_per * cell + iVar9] == node1) {
                uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
                if (uVar4 != 0) {
                  pcVar8 = "cell nodes";
                  uVar7 = 0x2d0;
LAB_001eaf16:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,uVar7,"ref_split_edge_density",(ulong)uVar4,pcVar8);
                  return uVar4;
                }
                iVar5 = ref_cell->node_per;
                if (0 < iVar5) {
                  lVar6 = 0;
                  do {
                    if (local_a8[lVar6] == node0) {
                      local_a8[lVar6] = new_node;
                      iVar5 = ref_cell->node_per;
                    }
                    lVar6 = lVar6 + 1;
                  } while (lVar6 < iVar5);
                }
                uVar4 = ref_node_tri_metric_area(local_e0,local_a8,&local_f0);
                if (uVar4 != 0) {
                  pcVar8 = "tri area";
                  uVar7 = 0x2d4;
                  goto LAB_001eaf16;
                }
                iVar5 = ref_cell->node_per;
                if (0 < iVar5) {
                  lVar6 = 0;
                  do {
                    if (local_a8[lVar6] == new_node) {
                      local_a8[lVar6] = node0;
                      iVar5 = ref_cell->node_per;
                    }
                    lVar6 = lVar6 + 1;
                  } while (lVar6 < iVar5);
                  if (0 < iVar5) {
                    lVar6 = 0;
                    do {
                      if (local_a8[lVar6] == node1) {
                        local_a8[lVar6] = new_node;
                        iVar5 = ref_cell->node_per;
                      }
                      lVar6 = lVar6 + 1;
                    } while (lVar6 < iVar5);
                  }
                }
                local_c8 = local_f0;
                dStack_c0 = 1.0;
                uVar4 = ref_node_tri_metric_area(local_e0,local_a8,&local_f0);
                if (uVar4 != 0) {
                  pcVar8 = "tri area";
                  uVar7 = 0x2de;
                  goto LAB_001eaf16;
                }
                local_b8 = local_b8 + local_c8 + local_f0;
                dStack_b0 = dStack_b0 + dStack_c0 + 1.0;
                RVar3 = ref_cell->node_per;
                cell = local_e4;
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < RVar3);
          }
          pRVar2 = ref_cell->ref_adj->item;
          local_d0 = (long)pRVar2[(int)local_d0].next;
          allowed = (REF_BOOL *)local_d8;
          if (local_d0 == -1) break;
          pRVar2 = pRVar2 + local_d0;
        } while( true );
      }
    }
    *allowed = (uint)(0.5 < (double)(~-(ulong)(0.5 < dStack_b0) & (ulong)local_b8 |
                                    (ulong)(local_b8 / dStack_b0) & -(ulong)(0.5 < dStack_b0)));
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_density(REF_GRID ref_grid, REF_INT node0,
                                          REF_INT node1, REF_INT new_node,
                                          REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL area, density, hits;

  *allowed = REF_TRUE;

  if (!ref_grid_twod(ref_grid)) {
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);

  density = 0.0;
  hits = 0.0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
    density += area;
    hits += 1.0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
    density += area;
    hits += 1.0;
  }

  if (hits > 0.5) density /= hits;

  if (density > 0.5) {
    *allowed = REF_TRUE;
  } else {
    *allowed = REF_FALSE;
  }

  return REF_SUCCESS;
}